

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_inttable_insert(upb_inttable *t,uintptr_t key,upb_value val,upb_Arena *a)

{
  undefined8 uVar1;
  _Bool _Var2;
  uint uVar3;
  uint32_t uVar4;
  upb_value *puVar5;
  size_t sVar6;
  upb_tabent *puVar7;
  lookupkey_t lVar8;
  upb_key tabkey;
  upb_tabent *e;
  upb_table new_table;
  size_t i;
  upb_Arena *a_local;
  uintptr_t key_local;
  upb_inttable *t_local;
  upb_value val_local;
  
  if (key < t->array_size) {
    _Var2 = upb_inttable_arrhas(t,key);
    if (_Var2) {
      __assert_fail("!upb_inttable_arrhas(t, key)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x2cf,
                    "_Bool upb_inttable_insert(upb_inttable *, uintptr_t, upb_value, upb_Arena *)");
    }
    t->array_count = t->array_count + 1;
    puVar5 = mutable_array(t);
    puVar5[key].val = val.val;
    t->presence_mask[key >> 3] = t->presence_mask[key >> 3] | (byte)(1 << ((byte)key & 7));
  }
  else {
    _Var2 = isfull(&t->t);
    if (_Var2) {
      _upb_log2_table_size(&t->t);
      uVar3 = init((EVP_PKEY_CTX *)&e);
      if ((uVar3 & 1) == 0) {
        return false;
      }
      for (new_table._8_8_ = begin(&t->t); uVar1 = new_table._8_8_, sVar6 = upb_table_size(&t->t),
          (ulong)uVar1 < sVar6; new_table._8_8_ = next(&t->t,new_table._8_8_)) {
        puVar7 = (t->t).entries + new_table._8_8_;
        lVar8 = intkey((puVar7->key).num);
        uVar4 = inthash(puVar7->key);
        insert((upb_table *)&e,lVar8,puVar7->key,(upb_value)(puVar7->val).val,uVar4,inthash,inteql);
      }
      if ((t->t).count != (uint32_t)new_table.entries) {
        __assert_fail("t->t.count == new_table.count",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0x2e3,
                      "_Bool upb_inttable_insert(upb_inttable *, uintptr_t, upb_value, upb_Arena *)"
                     );
      }
      (t->t).entries = e;
      (t->t).count = (uint32_t)new_table.entries;
      (t->t).mask = new_table.entries._4_4_;
    }
    lVar8 = intkey(key);
    uVar4 = upb_inthash(key);
    insert(&t->t,lVar8,(upb_key)key,val,uVar4,inthash,inteql);
  }
  check(t);
  return true;
}

Assistant:

bool upb_inttable_insert(upb_inttable* t, uintptr_t key, upb_value val,
                         upb_Arena* a) {
  if (key < t->array_size) {
    UPB_ASSERT(!upb_inttable_arrhas(t, key));
    t->array_count++;
    mutable_array(t)[key] = val;
    ((uint8_t*)t->presence_mask)[key / 8] |= (1 << (key % 8));
  } else {
    if (isfull(&t->t)) {
      /* Need to resize the hash part, but we re-use the array part. */
      size_t i;
      upb_table new_table;

      if (!init(&new_table, _upb_log2_table_size(&t->t) + 1, a)) {
        return false;
      }

      for (i = begin(&t->t); i < upb_table_size(&t->t); i = next(&t->t, i)) {
        const upb_tabent* e = &t->t.entries[i];
        insert(&new_table, intkey(e->key.num), e->key, e->val, inthash(e->key),
               &inthash, &inteql);
      }

      UPB_ASSERT(t->t.count == new_table.count);

      t->t = new_table;
    }
    upb_key tabkey = {.num = key};
    insert(&t->t, intkey(key), tabkey, val, upb_inthash(key), &inthash,
           &inteql);
  }
  check(t);
  return true;
}